

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

int GetMacroArgumentValue(char **src,char **dst)

{
  char cVar1;
  char *badValueMessage;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  char *local_50;
  uint local_40 [4];
  
  pcVar3 = *src;
  cVar1 = *pcVar3;
  while ((byte)(cVar1 - 1U) < 0x20) {
    pcVar3 = pcVar3 + 1;
    *src = pcVar3;
    cVar1 = *pcVar3;
  }
  pcVar3 = *dst;
  badValueMessage = *src;
  local_50 = pcVar3;
  do {
    pcVar4 = *src;
    cVar1 = *pcVar4;
    if ((cVar1 == '\0') || (cVar1 == ',')) {
      pcVar4 = *dst;
      while ((local_50 < pcVar4 && (pcVar5 = pcVar4 + -1, (byte)(*pcVar5 - 1U) < 0x20))) {
        *dst = pcVar5;
        pcVar4 = pcVar5;
      }
      *pcVar4 = '\0';
      if (*pcVar3 == '\0') {
        Warning("[Macro argument parser] empty value",badValueMessage,W_PASS3);
      }
      return 1;
    }
    local_40[0] = 1;
    local_40[1] = 2;
    local_40[2] = (badValueMessage != pcVar4) + 3;
    lVar7 = 0;
    do {
      uVar9 = (ulong)*(uint *)((long)local_40 + lVar7);
      if (" \"\'<"[uVar9] == cVar1) goto LAB_00125721;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0xc);
    uVar9 = 0;
LAB_00125721:
    if (((((int)uVar9 == 2) && (uVar9 = 2, badValueMessage < pcVar4)) &&
        ((byte)((pcVar4[-1] | 0x20U) - 0x30) < 10 || (byte)((pcVar4[-1] | 0x20U) + 0x9f) < 6)) &&
       (uVar9 = (ulong)((uint)(5 < (byte)((pcVar4[1] | 0x20U) + 0x9f)) * 2),
       (byte)((pcVar4[1] | 0x20U) - 0x30) < 10)) {
      uVar9 = 0;
    }
    uVar8 = (uint)uVar9;
    if (uVar8 == 3) {
LAB_001257a6:
      pcVar5 = *src;
      pcVar4 = pcVar5 + 1;
      *src = pcVar4;
      cVar1 = " \"\'>"[uVar9];
      cVar6 = pcVar5[1];
      while (cVar6 != '\0') {
        if (uVar8 == 1) {
          if ((cVar6 != '\\') || (pcVar4[1] == '\0')) goto LAB_00125840;
LAB_00125813:
          *src = pcVar4 + 1;
          cVar6 = *pcVar4;
          pcVar4 = *dst;
          *dst = pcVar4 + 1;
          *pcVar4 = cVar6;
          pcVar4 = *src;
LAB_00125848:
          *src = pcVar4 + 1;
          cVar6 = *pcVar4;
          pcVar4 = *dst;
          *dst = pcVar4 + 1;
          *pcVar4 = cVar6;
        }
        else {
          if (uVar8 == 2) {
            if ((cVar6 == '\'') && (pcVar4[1] == '\'')) goto LAB_00125813;
LAB_00125840:
            pcVar4 = *src;
            if (cVar1 != *pcVar4) goto LAB_00125848;
            break;
          }
          if (uVar8 != 3) {
            Error("Internal error. GetMacroArgumentValue()",(char *)0x0,FATAL);
            goto LAB_00125840;
          }
          if ((cVar6 != '!') || ((pcVar4[1] != '!' && (pcVar4[1] != '>')))) goto LAB_00125840;
          cVar6 = pcVar4[1];
          pcVar4 = *dst;
          *dst = pcVar4 + 1;
          *pcVar4 = cVar6;
          *src = *src + 2;
        }
        pcVar4 = *src;
        cVar6 = *pcVar4;
      }
      if (cVar1 == **src) {
        if (uVar8 < 3) {
          pcVar4 = *dst;
          *dst = pcVar4 + 1;
          *pcVar4 = cVar1;
        }
        local_50 = *dst;
        *src = *src + 1;
        bVar2 = false;
      }
      else {
        **dst = '\0';
        bVar2 = true;
      }
    }
    else {
      if (uVar8 != 0) {
        pcVar4 = *dst;
        *dst = pcVar4 + 1;
        *pcVar4 = cVar1;
        goto LAB_001257a6;
      }
      *src = pcVar4 + 1;
      cVar1 = *pcVar4;
      pcVar4 = *dst;
      *dst = pcVar4 + 1;
      *pcVar4 = cVar1;
      bVar2 = false;
    }
    if (bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

int GetMacroArgumentValue(char* & src, char* & dst) {
	SkipBlanks(src);
	const char* const dstOrig = dst, * const srcOrig = src;
	const char* dstStopTrim = dst;
	while (*src && ',' != *src) {
		// check if there is some kind of delimiter next (string literal or angle brackets expression)
		// the angle-bracket can only be used around whole argument (i.e. '<' must be first char)
		EDelimiterType delI = DelimiterBegins(src, srcOrig==src ? delimiters_all : delimiters_noAngle, false);
		// CPP numeric literals heuristic (eating digit-group apostrophes as regular digit char)
		if (DT_APOSTROPHE == delI && srcOrig < src) {
			const char prevC = 0x20 | src[-1];	// also lowercase any ASCII letter
			if (('0' <= prevC && prevC <= '9') || ('a' <= prevC && prevC <= 'f')) {
				// ahead of apostrophe is character which can work as digit (up to hexa system)
				// this heuristic doesn't bother to be super precise, because string-apostrophe
				// should be on word boundary any way, not preceded by *any* digit of any base.
				const char nextC = 0x20 | src[1];
				if (('0' <= nextC && nextC <= '9') || ('a' <= nextC && nextC <= 'f')) {
					// by same logic, if also char after the apostrophe is any digit (up to base16)
					// turn the apostrophe from delimiter into digit-grouping char
					delI = DT_NONE;
				}
			}
		}
		if (DT_NONE == delI) {		// no delimiter found, ordinary expression, copy char by char
			*dst++ = *src++;
			continue;
		}
		// some delimiter found - parse those properly by their type
		if (DT_ANGLE != delI) *dst++ = *src;	// quotes are part of parsed value, angles are NOT
		++src;									// advance over delimiter
		const char endCh = delimiters_e[delI];	// set expected ending delimiter
		while (*src) {
			// handle escape sequences by the type of delimiter
			switch (delI) {
			case DT_ANGLE:
				if (('!' == *src && '!' == src[1]) || ('!' == *src && '>' == src[1])) {
					*dst++ = src[1]; src += 2;	// escape sequence is converted into final char
					continue;
				}
				break;
			case DT_QUOTES:
				if ('\\' == *src && src[1]) {
					*dst++ = *src++;	*dst++ = *src++;
					continue;					// copy escape + escaped char (*any* non zero char)
				}
				break;
			case DT_APOSTROPHE:
				if ('\'' == *src && '\'' == src[1]) {
					*dst++ = *src++;	*dst++ = *src++;
					continue;					// copy two apostrophes (escaped apostrophe)
				}
				break;
			default:	Error("Internal error. GetMacroArgumentValue()", NULL, FATAL);
			}
			if (endCh == *src) break;			// ending delimiter found
			*dst++ = *src++;					// just copy character
		}
		// ending delimiter must be identical to endCh
		if (endCh != *src) {
			*dst = 0;							// zero terminator of resulting string value
			return 0;
		}
		// set ending delimiter for quotes and apostrophe (angles are stripped from value)
		if (DT_QUOTES == delI || DT_APOSTROPHE == delI) *dst++ = endCh;
		dstStopTrim = dst;						// should not trim right spaces beyond this point
		++src;									// advance over delimiter
	}
	while (dstStopTrim < dst && White(dst[-1])) --dst;	// trim the right size space from value
	*dst = 0;									// zero terminator of resulting string value
	if (! *dstOrig) Warning("[Macro argument parser] empty value", srcOrig);
	return 1;
}